

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O1

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_>::erase
          (map<long,_sjtu::LRUCache<sjtu::userType>::CacheNode_*,_std::less<long>_> *this,
          iterator *pos)

{
  runtime_error *this_00;
  
  if ((pos->cor == this) && (pos->ptr != this->nil)) {
    erase(this,pos->ptr);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x68);
  runtime_error::runtime_error(this_00);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void erase(iterator pos)
	{
		if (pos.cor != this || pos == end()) throw(runtime_error());
		erase(pos.ptr);
	}